

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Osc::set(V2Osc *this,syVOsc *para)

{
  float fVar1;
  float fVar2;
  
  this->mode = (int)para->mode;
  this->ring = (bool)((byte)(int)para->ring & 1);
  fVar1 = (para->detune + -64.0) * 0.0078125 + para->pitch + -64.0;
  this->pitch = fVar1;
  fVar2 = this->inst->SRfclinfreq;
  fVar1 = exp2f(((fVar1 + 64.0) * 0.0078125 + -1.0) * 10.0);
  this->nffrq = fVar1 * fVar2;
  fVar2 = this->inst->SRfcobasefrq;
  fVar1 = exp2f((this->pitch + this->note + -60.0) / 12.0);
  this->freq = (int)(fVar1 * fVar2);
  this->gain = para->gain * 0.0078125;
  fVar2 = para->color * 0.0078125;
  this->brpt = (int)(fVar2 * 2.1474836e+09) * 2;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  this->nfres = 1.0 - fVar2;
  return;
}

Assistant:

void set(const syVOsc *para)
    {
        mode = (int)para->mode;
        ring = (((int)para->ring) & 1) != 0;

        pitch = (para->pitch - 64.0f) + (para->detune - 64.0f) / 128.0f;
        chgPitch();
        gain = para->gain / 128.0f;

        float col = para->color / 128.0f;
        brpt = ftou32(col);
        nfres = 1.0f - sqrtf(col);
    }